

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::invalid_option_format_error::invalid_option_format_error
          (invalid_option_format_error *this,string *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  string local_30 [48];
  
  __lhs = &local_70;
  std::operator+(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,in_RDI);
  OptionSpecException::OptionSpecException((OptionSpecException *)in_RDI,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::__cxx11::string::~string((string *)&local_70);
  *(undefined ***)in_RDI = &PTR__invalid_option_format_error_001b3de0;
  return;
}

Assistant:

invalid_option_format_error(const std::string& format)
                : OptionSpecException(u8"Invalid option format " + LQUOTE + format + RQUOTE)
        {
        }